

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O0

vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
* vkt::FragmentOperations::anon_unknown_0::genVertices
            (vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
             *__return_storage_ptr__,TestPrimitive primitive,Vec4 *renderArea,Vec4 *primitiveColor)

{
  float fVar1;
  float fVar2;
  VertexData local_1e4;
  VertexData local_1c4;
  VertexData local_1a4;
  VertexData local_184;
  VertexData local_164;
  VertexData local_144;
  VertexData local_124;
  VertexData local_104;
  float local_e4;
  float local_e0;
  float y_2;
  float x_2;
  int i_2;
  VertexData local_b8;
  float local_98;
  float local_94;
  float y_1;
  float x_1;
  int i_1;
  float local_6c;
  float local_68;
  float y;
  float x;
  int i;
  float size;
  float ry;
  float rx;
  float y0;
  float x0;
  undefined1 local_3c [8];
  Random rng;
  Vec4 *primitiveColor_local;
  Vec4 *renderArea_local;
  TestPrimitive primitive_local;
  vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  *vertices;
  
  rng.m_rnd.z._3_1_ = 0;
  unique0x10000395 = primitiveColor;
  std::
  vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ::vector(__return_storage_ptr__);
  de::Random::Random((Random *)local_3c,0x4d2);
  fVar2 = tcu::Vector<float,_4>::x(renderArea);
  rx = fVar2 + fVar2 + -1.0;
  fVar2 = tcu::Vector<float,_4>::y(renderArea);
  ry = fVar2 + fVar2 + -1.0;
  fVar2 = tcu::Vector<float,_4>::z(renderArea);
  size = fVar2 + fVar2;
  fVar2 = tcu::Vector<float,_4>::w(renderArea);
  i = (int)(fVar2 + fVar2);
  x = 0.2;
  switch(primitive) {
  case TEST_PRIMITIVE_POINTS:
    for (y = 0.0; fVar2 = rx, (int)y < 0x32; y = (float)((int)y + 1)) {
      local_68 = de::Random::getFloat((Random *)local_3c,0.0,size);
      fVar1 = ry;
      local_68 = fVar2 + local_68;
      local_6c = de::Random::getFloat((Random *)local_3c,0.0,(float)i);
      local_6c = fVar1 + local_6c;
      makeVertex((VertexData *)&x_1,local_68,local_6c,stack0xffffffffffffffd8);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(__return_storage_ptr__,(value_type *)&x_1);
    }
    break;
  case TEST_PRIMITIVE_LINES:
    for (y_1 = 0.0; fVar2 = rx, (int)y_1 < 0x1e; y_1 = (float)((int)y_1 + 1)) {
      local_94 = de::Random::getFloat((Random *)local_3c,0.0,size + -0.2);
      fVar1 = ry;
      local_94 = fVar2 + local_94;
      local_98 = de::Random::getFloat((Random *)local_3c,0.0,(float)i + -0.2);
      local_98 = fVar1 + local_98;
      makeVertex(&local_b8,local_94,local_98,stack0xffffffffffffffd8);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(__return_storage_ptr__,&local_b8);
      makeVertex((VertexData *)&x_2,local_94 + 0.2,local_98 + 0.2,stack0xffffffffffffffd8);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(__return_storage_ptr__,(value_type *)&x_2);
    }
    break;
  case TEST_PRIMITIVE_TRIANGLES:
    for (y_2 = 0.0; fVar2 = rx, (int)y_2 < 0x14; y_2 = (float)((int)y_2 + 1)) {
      local_e0 = de::Random::getFloat((Random *)local_3c,0.0,size + -0.2);
      fVar1 = ry;
      local_e0 = fVar2 + local_e0;
      local_e4 = de::Random::getFloat((Random *)local_3c,0.0,(float)i + -0.2);
      local_e4 = fVar1 + local_e4;
      makeVertex(&local_104,local_e0,local_e4,stack0xffffffffffffffd8);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(__return_storage_ptr__,&local_104);
      makeVertex(&local_124,local_e0 + 0.1,local_e4 + 0.2,stack0xffffffffffffffd8);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(__return_storage_ptr__,&local_124);
      makeVertex(&local_144,local_e0 + 0.2,local_e4,stack0xffffffffffffffd8);
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(__return_storage_ptr__,&local_144);
    }
    break;
  case TEST_PRIMITIVE_BIG_LINE:
    makeVertex(&local_164,rx,ry,stack0xffffffffffffffd8);
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::push_back(__return_storage_ptr__,&local_164);
    makeVertex(&local_184,rx + size,ry + (float)i,stack0xffffffffffffffd8);
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::push_back(__return_storage_ptr__,&local_184);
    break;
  case TEST_PRIMITIVE_BIG_TRIANGLE:
    makeVertex(&local_1a4,rx,ry,stack0xffffffffffffffd8);
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::push_back(__return_storage_ptr__,&local_1a4);
    makeVertex(&local_1c4,rx + size * 0.5,ry + (float)i,stack0xffffffffffffffd8);
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::push_back(__return_storage_ptr__,&local_1c4);
    makeVertex(&local_1e4,rx + size,ry,stack0xffffffffffffffd8);
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::push_back(__return_storage_ptr__,&local_1e4);
  }
  rng.m_rnd.z._3_1_ = 1;
  de::Random::~Random((Random *)local_3c);
  if ((rng.m_rnd.z._3_1_ & 1) == 0) {
    std::
    vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VertexData> genVertices (const TestPrimitive primitive, const Vec4& renderArea, const Vec4& primitiveColor)
{
	std::vector<VertexData> vertices;
	de::Random				rng			(1234);

	const float	x0		= 2.0f * renderArea.x() - 1.0f;
	const float y0		= 2.0f * renderArea.y() - 1.0f;
	const float	rx		= 2.0f * renderArea.z();
	const float	ry		= 2.0f * renderArea.w();
	const float	size	= 0.2f;

	switch (primitive)
	{
		case TEST_PRIMITIVE_POINTS:
			for (int i = 0; i < 50; ++i)
			{
				const float x = x0 + rng.getFloat(0.0f, rx);
				const float y = y0 + rng.getFloat(0.0f, ry);
				vertices.push_back(makeVertex(x, y, primitiveColor));
			}
			break;

		case TEST_PRIMITIVE_LINES:
			for (int i = 0; i < 30; ++i)
			{
				const float x = x0 + rng.getFloat(0.0f, rx - size);
				const float y = y0 + rng.getFloat(0.0f, ry - size);
				vertices.push_back(makeVertex(x,        y,        primitiveColor));
				vertices.push_back(makeVertex(x + size, y + size, primitiveColor));
			}
			break;

		case TEST_PRIMITIVE_TRIANGLES:
			for (int i = 0; i < 20; ++i)
			{
				const float x = x0 + rng.getFloat(0.0f, rx - size);
				const float y = y0 + rng.getFloat(0.0f, ry - size);
				vertices.push_back(makeVertex(x,             y,        primitiveColor));
				vertices.push_back(makeVertex(x + size/2.0f, y + size, primitiveColor));
				vertices.push_back(makeVertex(x + size,      y,        primitiveColor));
			}
			break;

		case TEST_PRIMITIVE_BIG_LINE:
			vertices.push_back(makeVertex(x0,      y0,      primitiveColor));
			vertices.push_back(makeVertex(x0 + rx, y0 + ry, primitiveColor));
			break;

		case TEST_PRIMITIVE_BIG_TRIANGLE:
			vertices.push_back(makeVertex(x0,           y0,      primitiveColor));
			vertices.push_back(makeVertex(x0 + rx/2.0f, y0 + ry, primitiveColor));
			vertices.push_back(makeVertex(x0 + rx,      y0,      primitiveColor));
			break;
	}

	return vertices;
}